

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O3

div * __thiscall poly::operator/(div *__return_storage_ptr__,poly *this,poly *f)

{
  poly *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_01;
  int j;
  int i;
  poly local_70;
  
  div::div(__return_storage_ptr__,
           (*(int *)&(f->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(f->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x1ffffffcU) << 3,(int)f);
  this_00 = &__return_storage_ptr__->rem;
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this_00->x,&this->x)
  ;
  (__return_storage_ptr__->rem)._degree = this->_degree;
  iVar1 = degree(f);
  if (iVar1 == 0) {
    iVar1 = operator[](f,0);
    if (iVar1 == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Division by is_zero");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poly(&local_70,
         (long)(int)((*(int *)&(f->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(f->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0x1ffffffcU) << 3));
    std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this_00->x,&local_70.x);
    (__return_storage_ptr__->rem)._degree = local_70._degree;
    std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70.x);
    std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
               &this->x);
    (__return_storage_ptr__->quot)._degree = this->_degree;
  }
  else {
    iVar1 = degree(this_00);
    while( true ) {
      iVar2 = degree(f);
      if (iVar1 < iVar2) break;
      iVar2 = operator[](this_00,iVar1);
      if (iVar2 != 0) {
        iVar2 = degree(f);
        xor_bit(&__return_storage_ptr__->quot,iVar1 - iVar2,1);
        i = 0;
        while( true ) {
          iVar3 = degree(f);
          if (iVar3 < i) break;
          iVar3 = operator[](f,i);
          xor_bit(this_00,(iVar1 - iVar2) + i,iVar3);
          i = i + 1;
        }
      }
      iVar1 = iVar1 + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

poly::div poly::operator/(const poly &f) const {
    div ans(f.bits());
    ans.rem = *this;
    if (f.degree() == 0) {
        if (f[0] == 0)
            throw std::runtime_error("Division by is_zero");
        ans.rem = poly(f.bits());
        ans.quot = *this;
        return ans;
    }

    auto &r = ans.rem;
    auto &q = ans.quot;
    for (int i = r.degree(); i >= f.degree(); i--) {
        if (r[i]) {
            int k = i - f.degree();
            q.xor_bit(k, 1);
            for (int j = 0; j <= f.degree(); j++)
                r.xor_bit(j + k, f[j]);
        }
    }

    return ans;
}